

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O2

ThresholdAlgorithmResult *
topk_algorithms::threshold_algorithm
          (ThresholdAlgorithmResult *__return_storage_ptr__,Problem *problem,RankSize k)

{
  Count *pCVar1;
  Key key;
  int iVar2;
  undefined4 extraout_var;
  pointer this;
  undefined4 extraout_var_00;
  ulong uVar3;
  pointer pQVar4;
  pointer pQVar5;
  Value VVar6;
  ulong uVar7;
  undefined4 extraout_var_01;
  Entry *pEVar8;
  size_type sVar9;
  RankSize RVar10;
  Rank *pRVar11;
  _Vector_base<Queue,_std::allocator<Queue>_> *p_Var12;
  __node_base_ptr p_Var13;
  Queue *this_00;
  RankSize *pRVar14;
  Queue *__cur;
  long lVar15;
  pointer pQVar16;
  ThresholdAlgorithmResult *this_01;
  undefined1 local_f0 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  processed_keys;
  Count local_b0;
  KeyValue local_a8;
  RankSize local_98;
  ulong local_88;
  RankSize local_80;
  RankSize *local_78;
  Value local_70;
  vector<Queue,_std::allocator<Queue>_> local_68;
  pointer local_50;
  ThresholdAlgorithmResult *local_48;
  __node_base_ptr local_40;
  pointer local_38;
  
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = k;
  local_78 = (RankSize *)problem;
  iVar2 = (**problem->_vptr_Problem)(problem);
  p_Var12 = (_Vector_base<Queue,_std::allocator<Queue>_> *)CONCAT44(extraout_var,iVar2);
  if ((_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555 < p_Var12) {
    std::__throw_length_error("vector::reserve");
  }
  if (p_Var12 == (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0) {
    this = (pointer)0x0;
    local_38 = (pointer)0x0;
  }
  else {
    this = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate(p_Var12,(size_t)problem);
    local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((long)p_Var12 * 0x18 + (long)this);
    local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
    _M_start = this;
    local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
    _M_finish = this;
    local_38 = local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
  local_88 = 0;
  local_70 = 0;
  local_b0 = 0;
  p_Var13 = (__node_base_ptr)0x0;
  processed_keys._M_h._M_single_bucket = (__node_base_ptr)p_Var12;
  local_50 = this;
  local_48 = __return_storage_ptr__;
  while (this_01 = local_48, pQVar5 = local_50, p_Var13 != processed_keys._M_h._M_single_bucket) {
    local_40 = p_Var13;
    iVar2 = (*(*(_func_int ***)local_78)[1])();
    RVar10 = CONCAT44(extraout_var_00,iVar2);
    if (this == local_38) {
      lVar15 = (long)this - (long)local_50;
      if (lVar15 == 0x7ffffffffffffff8) {
        local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_38;
        local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
        _M_start = local_50;
        local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
        _M_finish = this;
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar3 = lVar15 / 0x18;
      uVar7 = uVar3;
      if (this == local_50) {
        uVar7 = 1;
      }
      p_Var12 = (_Vector_base<Queue,_std::allocator<Queue>_> *)(uVar7 + uVar3);
      if ((_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555554 < p_Var12) {
        p_Var12 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
      }
      if (CARRY8(uVar7,uVar3)) {
        p_Var12 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
      }
      pQVar4 = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate
                         (p_Var12,(size_t)local_50);
      *(undefined8 *)((long)pQVar4 + lVar15) = 0;
      *(RankSize *)((long)pQVar4 + lVar15 + 8) = RVar10;
      *(undefined8 *)((long)pQVar4 + lVar15 + 0x10) = 0;
      pQVar16 = pQVar4;
      for (pQVar5 = local_50; pQVar5 != this; pQVar5 = (pointer)&pQVar5[1]._index) {
        pQVar16[1]._rank = pQVar5[1]._rank;
        RVar10 = pQVar5->_index;
        pQVar16->_rank = pQVar5->_rank;
        pQVar16->_index = RVar10;
        pQVar16 = (pointer)&pQVar16[1]._index;
      }
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50);
      }
      local_38 = (pointer)((long)pQVar4 + (long)p_Var12 * 0x18);
      RVar10 = pQVar16->_index;
      pRVar11 = pQVar16[1]._rank;
      this = pQVar16;
    }
    else {
      this->_rank = (Rank *)0x0;
      this->_index = RVar10;
      this[1]._rank = (Rank *)0x0;
      pRVar11 = (Rank *)0x0;
      pQVar4 = local_50;
    }
    if (pRVar11 < (Rank *)((*(long *)(RVar10 + 0x10) - *(long *)(RVar10 + 8)) / 0x18)) {
      VVar6 = threshold_algorithm::Queue::head_value((Queue *)this);
      local_70 = local_70 + VVar6;
      uVar7 = (*(long *)(this->_index + 0x10) - *(long *)(this->_index + 8)) / 0x18;
      if (local_88 <= uVar7) {
        local_88 = uVar7;
      }
      local_b0 = local_b0 + uVar7;
      this = (pointer)&this[1]._index;
    }
    local_50 = pQVar4;
    p_Var13 = (__node_base_ptr)((long)&local_40->_M_nxt + 1);
  }
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_50;
  local_f0 = (undefined1  [8])&processed_keys._M_h._M_rehash_policy._M_next_resize;
  processed_keys._M_h._M_buckets = (__buckets_ptr)0x1;
  processed_keys._M_h._M_bucket_count = 0;
  processed_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  processed_keys._M_h._M_element_count._0_4_ = 0x3f800000;
  processed_keys._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  processed_keys._M_h._M_rehash_policy._4_4_ = 0;
  processed_keys._M_h._M_rehash_policy._M_next_resize = 0;
  (local_48->stats).random_access_miss = 0;
  (local_48->stats).k = 0;
  (local_48->stats).num_ranks = 0;
  (local_48->stats).largest_rank = 0;
  (local_48->stats).ordered_access_miss = 0;
  (local_48->stats).random_access_hit = 0;
  (local_48->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_48->stats).ordered_access_hit = 0;
  (local_48->stats).entries = 0;
  (local_48->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_48->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_48->topk)._k = local_80;
  (local_48->stats).k = local_80;
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_finish = this;
  iVar2 = (***(_func_int ***)local_78)();
  (this_01->stats).num_ranks = CONCAT44(extraout_var_01,iVar2);
  (this_01->stats).largest_rank = local_88;
  (this_01->stats).entries = local_b0;
  local_78 = &pQVar5->_index;
  local_40 = (__node_base_ptr)0x0;
LAB_0011089b:
  pQVar4 = (pointer)(((long)this - (long)pQVar5) / 0x18);
  local_38 = pQVar4;
  while( true ) {
    this_00 = (Queue *)((long)local_40 * 0x18 + (long)pQVar5);
    while( true ) {
      if (pQVar4 <= local_40) goto LAB_00110a8e;
      if ((ulong)((*(long *)(*(long *)(this_00 + 8) + 0x10) - *(long *)(*(long *)(this_00 + 8) + 8))
                 / 0x18) <= *(ulong *)(this_00 + 0x10)) {
        local_70 = local_70 - *(long *)this_00;
        pRVar14 = &this[-2]._index;
        local_98 = *(RankSize *)(this_00 + 0x10);
        local_a8._key = *(Key *)this_00;
        local_a8._value = *(Value *)(this_00 + 8);
        *(RankSize *)(this_00 + 0x10) = this[-1]._index;
        pRVar11 = this[-1]._rank;
        *(RankSize *)this_00 = this[-2]._index;
        *(Rank **)(this_00 + 8) = pRVar11;
        this[-1]._index = local_98;
        this[-2]._index = local_a8._key;
        this[-1]._rank = (Rank *)local_a8._value;
        pQVar5 = local_50;
        this = (pointer)pRVar14;
        if ((ulong)(((long)pRVar14 - (long)local_50) / 0x18) <= local_40) {
          local_40 = (__node_base_ptr)0x0;
        }
        goto LAB_0011089b;
      }
      VVar6 = threshold_algorithm::Queue::head_value(this_00);
      *(Value *)this_00 = VVar6;
      pEVar8 = rank::Rank::top(*(Rank **)(this_00 + 8),*(RankSize *)(this_00 + 0x10));
      *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
      VVar6 = threshold_algorithm::Queue::head_value(this_00);
      lVar15 = *(long *)this_00;
      *(Value *)this_00 = lVar15 - VVar6;
      local_a8._key = (pEVar8->_key_value)._key;
      sVar9 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_f0,&local_a8._key);
      local_70 = local_70 - (lVar15 - VVar6);
      if (sVar9 == 0) break;
      pCVar1 = &(local_48->stats).ordered_access_miss;
      *pCVar1 = *pCVar1 + 1;
      this_01 = local_48;
    }
    (local_48->stats).ordered_access_hit = (local_48->stats).ordered_access_hit + 1;
    key = (pEVar8->_key_value)._key;
    pRVar11 = (Rank *)(pEVar8->_key_value)._value;
    pRVar14 = local_78;
    for (uVar7 = 0; pQVar4 != (pointer)uVar7; uVar7 = uVar7 + 1) {
      if (local_40 != (__node_base_ptr)uVar7) {
        VVar6 = rank::Rank::value_of((Rank *)*pRVar14,key);
        pRVar11 = (Rank *)(&pRVar11->_dirty + VVar6);
        pCVar1 = &(local_48->stats).random_access_hit + (VVar6 == 0);
        *pCVar1 = *pCVar1 + 1;
        pQVar4 = local_38;
      }
      pRVar14 = pRVar14 + 3;
    }
    local_a8._key = key;
    std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)local_f0,&local_a8._key);
    this_01 = local_48;
    local_a8._key = key;
    local_a8._value = (Value)pRVar11;
    TopK::insert(&local_48->topk,&local_a8);
    pQVar4 = local_38;
    if ((local_80 != 0) &&
       (RVar10 = TopK::count_entries_above_or_equal(&this_01->topk,local_70), local_80 <= RVar10))
    break;
    local_40 = (__node_base_ptr)(((long)local_40 + 1U) % (ulong)pQVar4);
    pQVar5 = local_50;
  }
LAB_00110a8e:
  local_68.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_finish = this;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_f0);
  std::vector<Queue,_std::allocator<Queue>_>::~vector(&local_68);
  return this_01;
}

Assistant:

ThresholdAlgorithmResult threshold_algorithm(const Problem *problem, RankSize k) {

        //
        struct Queue {
            Queue(const Rank* rank): _rank(rank) {};
            bool empty() const { return _index >= _rank->size(); }
            Value head_value() const { return _index < _rank->size() ? _rank->top(_index).value() : 0; }
            Value value_of(Key key) const { return _rank->value_of(key); }
            const Entry* next() {
                if (_index < _rank->size()) {
                    _head_value_drop = head_value();
                    auto &result = _rank->top(_index);
                    ++_index;
                    _head_value_drop -= head_value();
                    return &result;
                }
                else {
                    return nullptr;
                }
            }
            Value head_value_drop() const { return _head_value_drop; }
            Value _head_value_drop { 0 };
            const Rank* _rank;
            RankSize _index { 0 };
        };

        // create m queues
        Count largest_rank = 0;
        Count entries      = 0;
        
        std::vector<Queue> queues;
        Value              head_sum = 0;
        auto m = problem->size();
        queues.reserve(m);
        for (auto i=0;i<m;++i) {
            queues.push_back(Queue(problem->rank(i)));
            if (!queues.back().empty()) {
                head_sum += queues.back().head_value();
                
                auto rank_size = queues.back()._rank->size();
                largest_rank   = std::max(largest_rank, rank_size);
                entries       += rank_size;
                
                
            }
            else {
                queues.pop_back();
            }
        };

        std::unordered_set<Key> processed_keys;

        ThresholdAlgorithmResult result;
        result.topk.k(k);
        auto &topk  = result.topk;
        auto &stats = result.stats;

        stats.k            = k;
        stats.num_ranks    = problem->size();
        stats.largest_rank = largest_rank;
        stats.entries      = entries;

        std::size_t i = 0;
        while (i < queues.size()) {

            // for each queue generate next element
            auto &q = queues.at(i);

            auto top_record  = q.next();
            head_sum        -= q.head_value_drop();

            if ( top_record ) {
                if (!processed_keys.count(top_record->key())) {

                    ++stats.ordered_access_hit;

                    // if key has not beed processed
                    auto record = KeyValue { top_record->key(), top_record->value() };

                    // add all summands to record
                    for (auto j=0;j<queues.size();++j) {
                        if (i != j) {
                            auto value = queues[j].value_of(record.key());
                            record.value_add(value);
                            if (value) {
                                ++stats.random_access_hit;
                            }
                            else {
                                ++stats.random_access_miss;
                            }
                        }
                    }

                    processed_keys.insert(record.key());

                    topk.insert({record.key(), record.value()});

                    if (k && topk.count_entries_above_or_equal(head_sum) >= k) {
                        // proven that we have a valid set of topk entries
                        break;
                    }

                    i = (i + 1) % queues.size();
                }
                else {
                    ++stats.ordered_access_miss;
                }
            }
            else { // queue is emtpy
                std::swap(queues[i], queues.back());
                queues.pop_back();
                if (i >= queues.size()) {
                    i = 0;
                }
            }
        }

        return result;
    
    }